

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int flatcc_builder_check_required(flatcc_builder_t *B,flatbuffers_voffset_t *required,int count)

{
  int iVar1;
  ulong uVar2;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x526,
                  "int flatcc_builder_check_required(flatcc_builder_t *, const flatbuffers_voffset_t *, int)"
                 );
  }
  iVar1 = 0;
  if ((count <= (int)(uint)B->id_end) && (iVar1 = 1, 0 < count)) {
    uVar2 = 0;
    do {
      if (B->vs[required[uVar2]] == 0) {
        return 0;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  return iVar1;
}

Assistant:

int flatcc_builder_check_required(flatcc_builder_t *B, const flatbuffers_voffset_t *required, int count)
{
    int i;

    check(frame(type) == flatcc_builder_table, "expected table frame");

    if (B->id_end < count) {
        return 0;
    }
    for (i = 0; i < count; ++i) {
        if (B->vs[required[i]] == 0) {
            return 0;
        }
    }
    return 1;
}